

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_points_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::FloatPointsTreeDecoder::DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
          (FloatPointsTreeDecoder *this,DecoderBuffer *buffer,
          PointAttributeVectorOutputIterator<float> *out)

{
  long lVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  PointCloudCompressionMethod PVar5;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_> qpoints
  ;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  local_38;
  __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  local_20;
  __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  local_18;
  
  local_38.
  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = buffer->pos_;
  lVar1 = lVar3 + 4;
  if (lVar1 <= buffer->data_size_) {
    iVar2 = *(int *)(buffer->data_ + lVar3);
    buffer->pos_ = lVar1;
    if (iVar2 == 2) {
      bVar4 = DecodePointCloudKdTreeInternal(this,buffer,&local_38);
LAB_0014096d:
      if (bVar4 != false) {
        local_18._M_current =
             local_38.
             super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_20._M_current =
             local_38.
             super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        DequantizePoints3<__gnu_cxx::__normal_iterator<draco::VectorD<unsigned_int,3>*,std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::PointAttributeVectorOutputIterator<float>>
                  (&local_18,&local_20,&this->qinfo_,out);
        bVar4 = true;
        goto LAB_001409a7;
      }
    }
    else if (iVar2 == 3) {
      if (lVar3 + 5 <= buffer->data_size_) {
        PVar5 = (PointCloudCompressionMethod)buffer->data_[lVar1];
        buffer->pos_ = lVar3 + 5;
        this->method_ = PVar5;
        if (PVar5 == KDTREE) {
          bVar4 = DecodePointCloudKdTreeInternal(this,buffer,&local_38);
          goto LAB_0014096d;
        }
        DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>();
      }
    }
    else {
      DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>();
    }
  }
  bVar4 = false;
LAB_001409a7:
  if (local_38.
      super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool FloatPointsTreeDecoder::DecodePointCloud(DecoderBuffer *buffer,
                                              OutputIteratorT &out) {
  std::vector<Point3ui> qpoints;

  uint32_t decoded_version;
  if (!buffer->Decode(&decoded_version)) {
    return false;
  }

  if (decoded_version == 3) {
    int8_t method_number;
    if (!buffer->Decode(&method_number)) {
      return false;
    }

    method_ = static_cast<PointCloudCompressionMethod>(method_number);

    if (method_ == KDTREE) {
      if (!DecodePointCloudKdTreeInternal(buffer, &qpoints)) {
        return false;
      }
    } else {  // Unsupported method.
      fprintf(stderr, "Method not supported. \n");
      return false;
    }
  } else if (decoded_version == 2) {  // Version 2 only uses KDTREE method.
    if (!DecodePointCloudKdTreeInternal(buffer, &qpoints)) {
      return false;
    }
  } else {  // Unsupported version.
    fprintf(stderr, "Version not supported. \n");
    return false;
  }

  DequantizePoints3(qpoints.begin(), qpoints.end(), qinfo_, out);
  return true;
}